

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

void embree::avx::InstanceArrayIntersector1::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  int iVar2;
  Geometry *pGVar3;
  RTCRayQueryContext *pRVar4;
  long *plVar5;
  long lVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  _func_int *p_Var16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM0 [64];
  vfloat4 a0_1;
  undefined1 in_ZMM1 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM2 [64];
  vfloat4 a0;
  undefined1 auVar36 [16];
  undefined1 in_ZMM3 [64];
  float fVar37;
  float fVar42;
  float fVar43;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  vfloat4 b0;
  float fVar48;
  float fVar49;
  float fVar52;
  float fVar53;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar54;
  undefined1 auVar55 [16];
  vfloat4 a1;
  RayQueryContext newcontext;
  
  a0.field_0 = in_ZMM3._0_16_;
  auVar35 = in_ZMM2._0_16_;
  auVar33 = in_ZMM0._0_16_;
  a0_1.field_0 = in_ZMM1._0_16_;
  uVar1 = prim->primID_;
  pGVar3 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var16 = *(_func_int **)&pGVar3->field_0x58;
  if (p_Var16 == (_func_int *)0x0) {
    uVar15 = (ulong)*(uint *)(*(long *)&pGVar3[1].time_range.upper +
                             (long)pGVar3[1].intersectionFilterN * (ulong)uVar1);
    if (uVar15 == 0xffffffff) {
      p_Var16 = (_func_int *)0x0;
    }
    else {
      p_Var16 = pGVar3[1].super_RefCount._vptr_RefCount[uVar15];
    }
  }
  if (((p_Var16 != (_func_int *)0x0) && (((ray->super_RayK<1>).mask & pGVar3->mask) != 0)) &&
     (pRVar4 = context->user, pRVar4->instID[0] == 0xffffffff)) {
    pRVar4->instID[0] = prim->instID_;
    pRVar4->instPrimID[0] = uVar1;
    uVar15 = (ulong)prim->primID_;
    plVar5 = *(long **)&pGVar3[1].fnumTimeSegments;
    iVar2 = (int)plVar5[4];
    if ((pGVar3->field_8).field_0x1 == '\x01') {
      if (iVar2 == 0x9134) {
        lVar6 = *plVar5;
        lVar17 = uVar15 * plVar5[2];
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar17)),
                                ZEXT416(*(uint *)(lVar6 + 0x10 + lVar17)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar17)),0x28);
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar17)),
                                ZEXT416(*(uint *)(lVar6 + 0x14 + lVar17)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar17)),0x28);
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar17)),
                                ZEXT416(*(uint *)(lVar6 + 0x18 + lVar17)),0x1c);
        auVar35 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar17)),0x28);
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar17)),
                                ZEXT416(*(uint *)(lVar6 + 0x1c + lVar17)),0x1c);
        auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar17)),0x28);
      }
      else if (iVar2 == 0x9234) {
        lVar6 = *plVar5;
        lVar17 = uVar15 * plVar5[2];
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *(ulong *)(lVar6 + 4 + lVar17);
        auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + lVar17)),auVar27,0x4c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar33,auVar33,0x78);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar17);
        auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar17)),auVar28,0x4c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar33,auVar33,0x78);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar17);
        auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar17)),auVar29,0x4c);
        auVar35 = vshufps_avx(auVar33,auVar33,0x78);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar17);
        auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar17)),auVar30,0x4c);
        auVar33 = vshufps_avx(auVar33,auVar33,0x78);
      }
      else if (iVar2 == 0xb001) {
        lVar6 = *plVar5;
        lVar17 = uVar15 * plVar5[2];
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar17);
        auVar35 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(lVar6 + 8 + lVar17)),0x20);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar17);
        auVar33 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + lVar17)),auVar32);
        auVar27 = vshufps_avx(auVar33,auVar32,0xd8);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar17);
        auVar33 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar17)),auVar41);
        auVar28 = vshufps_avx(auVar33,auVar41,0xd8);
        fVar37 = *(float *)(lVar6 + 0x24 + lVar17);
        fVar49 = *(float *)(lVar6 + 0x28 + lVar17);
        fVar45 = *(float *)(lVar6 + 0x2c + lVar17);
        fVar46 = *(float *)(lVar6 + 0x30 + lVar17);
        fVar52 = fVar46 * fVar46 + fVar45 * fVar45 + fVar37 * fVar37 + fVar49 * fVar49;
        auVar33 = vrsqrtss_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52));
        fVar42 = auVar33._0_4_;
        fVar52 = fVar42 * 1.5 + fVar42 * fVar42 * fVar42 * fVar52 * -0.5;
        auVar33 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar52 * fVar37)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar27,ZEXT416((uint)(fVar52 * fVar49)),0x30);
        auVar27 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar17)),
                                ZEXT416(*(uint *)(lVar6 + 4 + lVar17)),0x10);
        auVar35 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar52 * fVar46)),0x30);
        auVar27 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar17)),0x20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar27,ZEXT416((uint)(fVar52 * fVar45)),0x30);
      }
      else if (iVar2 == 0x9244) {
        lVar6 = *plVar5;
        lVar17 = uVar15 * plVar5[2];
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar6 + lVar17);
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar6 + 0x10 + lVar17);
        auVar35 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar17);
        auVar33 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar17);
      }
      auVar27 = vshufps_avx(auVar33,auVar33,0xff);
      auVar28 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
      auVar29 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar30 = vshufps_avx(auVar35,auVar35,0xff);
      fVar44 = auVar28._0_4_;
      fVar43 = auVar27._0_4_;
      fVar54 = auVar29._0_4_;
      fVar8 = auVar30._0_4_;
      fVar37 = fVar44 * fVar54 + fVar8 * fVar43;
      fVar46 = fVar44 * fVar54 - fVar8 * fVar43;
      fVar52 = fVar43 * fVar43 - fVar44 * fVar44;
      fVar42 = fVar44 * fVar8 - fVar54 * fVar43;
      fVar49 = fVar44 * fVar8 + fVar54 * fVar43;
      fVar45 = fVar44 * fVar43 + fVar54 * fVar8;
      fVar53 = fVar54 * fVar8 - fVar44 * fVar43;
      auVar27 = ZEXT416((uint)(-fVar8 * fVar8 + -fVar54 * fVar54 + fVar43 * fVar43 + fVar44 * fVar44
                              ));
      auVar27 = vshufps_avx(auVar27,auVar27,0);
      auVar28 = ZEXT416((uint)(fVar37 + fVar37));
      auVar28 = vshufps_avx(auVar28,auVar28,0);
      auVar29 = ZEXT416((uint)(fVar42 + fVar42));
      auVar29 = vshufps_avx(auVar29,auVar29,0);
      fVar37 = auVar27._0_4_ * 1.0 + auVar28._0_4_ * 0.0 + auVar29._0_4_ * 0.0;
      fVar42 = auVar27._4_4_ * 0.0 + auVar28._4_4_ * 1.0 + auVar29._4_4_ * 0.0;
      fVar43 = auVar27._8_4_ * 0.0 + auVar28._8_4_ * 0.0 + auVar29._8_4_ * 1.0;
      fVar44 = auVar27._12_4_ * 0.0 + auVar28._12_4_ * 0.0 + auVar29._12_4_ * 0.0;
      auVar27 = ZEXT416((uint)(-fVar8 * fVar8 + fVar54 * fVar54 + fVar52));
      auVar27 = vshufps_avx(auVar27,auVar27,0);
      auVar28 = ZEXT416((uint)(fVar45 + fVar45));
      auVar28 = vshufps_avx(auVar28,auVar28,0);
      auVar29 = ZEXT416((uint)(fVar46 + fVar46));
      auVar29 = vshufps_avx(auVar29,auVar29,0);
      fVar45 = auVar29._0_4_ * 1.0 + auVar27._0_4_ * 0.0 + auVar28._0_4_ * 0.0;
      fVar46 = auVar29._4_4_ * 0.0 + auVar27._4_4_ * 1.0 + auVar28._4_4_ * 0.0;
      fVar47 = auVar29._8_4_ * 0.0 + auVar27._8_4_ * 0.0 + auVar28._8_4_ * 1.0;
      fVar48 = auVar29._12_4_ * 0.0 + auVar27._12_4_ * 0.0 + auVar28._12_4_ * 0.0;
      auVar27 = ZEXT416((uint)(-fVar54 * fVar54 + fVar52 + fVar8 * fVar8));
      auVar28 = vshufps_avx(auVar27,auVar27,0);
      auVar27 = ZEXT416((uint)(fVar53 + fVar53));
      auVar29 = vshufps_avx(auVar27,auVar27,0);
      auVar27 = ZEXT416((uint)(fVar49 + fVar49));
      auVar30 = vshufps_avx(auVar27,auVar27,0);
      auVar27 = vshufps_avx((undefined1  [16])a0_1.field_0,ZEXT416(0) << 0x20,0xe9);
      auVar27 = vblendps_avx(auVar27,(undefined1  [16])a0.field_0,4);
      fVar49 = auVar30._0_4_ * 1.0 + auVar29._0_4_ * 0.0 + auVar28._0_4_ * 0.0;
      fVar52 = auVar30._4_4_ * 0.0 + auVar29._4_4_ * 1.0 + auVar28._4_4_ * 0.0;
      fVar53 = auVar30._8_4_ * 0.0 + auVar29._8_4_ * 0.0 + auVar28._8_4_ * 1.0;
      fVar54 = auVar30._12_4_ * 0.0 + auVar29._12_4_ * 0.0 + auVar28._12_4_ * 0.0;
      auVar28 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0);
      a0_1.field_0._0_4_ = auVar28._0_4_ * fVar37 + fVar49 * 0.0 + fVar45 * 0.0;
      a0_1.field_0._4_4_ = auVar28._4_4_ * fVar42 + fVar52 * 0.0 + fVar46 * 0.0;
      a0_1.field_0._8_4_ = auVar28._8_4_ * fVar43 + fVar53 * 0.0 + fVar47 * 0.0;
      a0_1.field_0._12_4_ = auVar28._12_4_ * fVar44 + fVar54 * 0.0 + fVar48 * 0.0;
      auVar28 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0);
      auVar29 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0x55);
      a0.field_0._0_4_ = auVar28._0_4_ * fVar37 + fVar49 * 0.0 + auVar29._0_4_ * fVar45;
      a0.field_0._4_4_ = auVar28._4_4_ * fVar42 + fVar52 * 0.0 + auVar29._4_4_ * fVar46;
      a0.field_0._8_4_ = auVar28._8_4_ * fVar43 + fVar53 * 0.0 + auVar29._8_4_ * fVar47;
      a0.field_0._12_4_ = auVar28._12_4_ * fVar44 + fVar54 * 0.0 + auVar29._12_4_ * fVar48;
      auVar28 = vshufps_avx(auVar35,auVar35,0x55);
      auVar29 = vshufps_avx(auVar35,auVar35,0xaa);
      auVar30 = vshufps_avx(auVar35,auVar35,0);
      auVar35._0_4_ = auVar30._0_4_ * fVar37 + auVar29._0_4_ * fVar49 + auVar28._0_4_ * fVar45;
      auVar35._4_4_ = auVar30._4_4_ * fVar42 + auVar29._4_4_ * fVar52 + auVar28._4_4_ * fVar46;
      auVar35._8_4_ = auVar30._8_4_ * fVar43 + auVar29._8_4_ * fVar53 + auVar28._8_4_ * fVar47;
      auVar35._12_4_ = auVar30._12_4_ * fVar44 + auVar29._12_4_ * fVar54 + auVar28._12_4_ * fVar48;
      auVar28 = vshufps_avx(auVar33,auVar33,0xaa);
      auVar29 = vshufps_avx(auVar33,auVar33,0x55);
      auVar30 = vshufps_avx(auVar33,auVar33,0);
      auVar33._0_4_ =
           auVar27._0_4_ + 0.0 +
           auVar30._0_4_ * fVar37 + auVar29._0_4_ * fVar45 + auVar28._0_4_ * fVar49;
      auVar33._4_4_ =
           auVar27._4_4_ + 0.0 +
           auVar30._4_4_ * fVar42 + auVar29._4_4_ * fVar46 + auVar28._4_4_ * fVar52;
      auVar33._8_4_ =
           auVar27._8_4_ + 0.0 +
           auVar30._8_4_ * fVar43 + auVar29._8_4_ * fVar47 + auVar28._8_4_ * fVar53;
      auVar33._12_4_ =
           auVar27._12_4_ + 0.0 +
           auVar30._12_4_ * fVar44 + auVar29._12_4_ * fVar48 + auVar28._12_4_ * fVar54;
    }
    else if (iVar2 == 0x9134) {
      lVar6 = *plVar5;
      lVar17 = uVar15 * plVar5[2];
      auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar17)),
                              ZEXT416(*(uint *)(lVar6 + 0x10 + lVar17)),0x1c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar17)),0x28);
      auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar17)),
                              ZEXT416(*(uint *)(lVar6 + 0x14 + lVar17)),0x1c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar17)),0x28);
      auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar17)),
                              ZEXT416(*(uint *)(lVar6 + 0x18 + lVar17)),0x1c);
      auVar35 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar17)),0x28);
      auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar17)),
                              ZEXT416(*(uint *)(lVar6 + 0x1c + lVar17)),0x1c);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar17)),0x28);
    }
    else if (iVar2 == 0x9234) {
      lVar6 = *plVar5;
      lVar17 = uVar15 * plVar5[2];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)(lVar6 + 4 + lVar17);
      auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + lVar17)),auVar18,0x4c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar33,auVar33,0x78);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar17);
      auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar17)),auVar19,0x4c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar33,auVar33,0x78);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar17);
      auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar17)),auVar20,0x4c);
      auVar35 = vshufps_avx(auVar33,auVar33,0x78);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar17);
      auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar17)),auVar21,0x4c);
      auVar33 = vshufps_avx(auVar33,auVar33,0x78);
    }
    else if (iVar2 == 0xb001) {
      lVar6 = *plVar5;
      lVar17 = uVar15 * plVar5[2];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar17);
      auVar35 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(lVar6 + 8 + lVar17)),0x20);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar17);
      auVar33 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + lVar17)),auVar23);
      auVar27 = vshufps_avx(auVar33,auVar23,0xd8);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar17);
      auVar33 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar17)),auVar38);
      auVar28 = vshufps_avx(auVar33,auVar38,0xd8);
      fVar37 = *(float *)(lVar6 + 0x24 + lVar17);
      fVar49 = *(float *)(lVar6 + 0x28 + lVar17);
      fVar45 = *(float *)(lVar6 + 0x2c + lVar17);
      fVar46 = *(float *)(lVar6 + 0x30 + lVar17);
      fVar52 = fVar46 * fVar46 + fVar45 * fVar45 + fVar37 * fVar37 + fVar49 * fVar49;
      auVar33 = vrsqrtss_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52));
      fVar42 = auVar33._0_4_;
      fVar52 = fVar42 * 1.5 + fVar42 * fVar42 * fVar42 * fVar52 * -0.5;
      auVar33 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar52 * fVar37)),0x30);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar27,ZEXT416((uint)(fVar52 * fVar49)),0x30);
      auVar27 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar17)),
                              ZEXT416(*(uint *)(lVar6 + 4 + lVar17)),0x10);
      auVar35 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar52 * fVar46)),0x30);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar17)),0x20);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar27,ZEXT416((uint)(fVar52 * fVar45)),0x30);
    }
    else if (iVar2 == 0x9244) {
      lVar6 = *plVar5;
      lVar17 = uVar15 * plVar5[2];
      a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar6 + lVar17))->v;
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar6 + 0x10 + lVar17))->v;
      auVar35 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar17);
      auVar33 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar17);
    }
    auVar27 = vshufps_avx(auVar35,auVar35,0xc9);
    auVar28 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
    auVar50._0_4_ = auVar28._0_4_ * auVar35._0_4_;
    auVar50._4_4_ = auVar28._4_4_ * auVar35._4_4_;
    auVar50._8_4_ = auVar28._8_4_ * auVar35._8_4_;
    auVar50._12_4_ = auVar28._12_4_ * auVar35._12_4_;
    auVar55._0_4_ = a0.field_0._0_4_ * auVar27._0_4_;
    auVar55._4_4_ = a0.field_0._4_4_ * auVar27._4_4_;
    auVar55._8_4_ = a0.field_0._8_4_ * auVar27._8_4_;
    auVar55._12_4_ = a0.field_0._12_4_ * auVar27._12_4_;
    auVar31 = vsubps_avx(auVar55,auVar50);
    auVar29 = vshufps_avx(auVar31,auVar31,0xc9);
    auVar30 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
    auVar39._0_4_ = a0_1.field_0._0_4_ * auVar27._0_4_;
    auVar39._4_4_ = a0_1.field_0._4_4_ * auVar27._4_4_;
    auVar39._8_4_ = a0_1.field_0._8_4_ * auVar27._8_4_;
    auVar39._12_4_ = a0_1.field_0._12_4_ * auVar27._12_4_;
    auVar34._0_4_ = auVar30._0_4_ * auVar35._0_4_;
    auVar34._4_4_ = auVar30._4_4_ * auVar35._4_4_;
    auVar34._8_4_ = auVar30._8_4_ * auVar35._8_4_;
    auVar34._12_4_ = auVar30._12_4_ * auVar35._12_4_;
    auVar27 = vsubps_avx(auVar34,auVar39);
    auVar36._0_4_ = auVar30._0_4_ * a0.field_0._0_4_;
    auVar36._4_4_ = auVar30._4_4_ * a0.field_0._4_4_;
    auVar36._8_4_ = auVar30._8_4_ * a0.field_0._8_4_;
    auVar36._12_4_ = auVar30._12_4_ * a0.field_0._12_4_;
    auVar40._0_4_ = a0_1.field_0._0_4_ * auVar28._0_4_;
    auVar40._4_4_ = a0_1.field_0._4_4_ * auVar28._4_4_;
    auVar40._8_4_ = a0_1.field_0._8_4_ * auVar28._8_4_;
    auVar40._12_4_ = a0_1.field_0._12_4_ * auVar28._12_4_;
    auVar28 = vsubps_avx(auVar40,auVar36);
    auVar35 = vshufps_avx(auVar28,auVar28,0xc9);
    auVar30 = vunpcklps_avx(auVar29,auVar35);
    auVar28 = vunpcklps_avx(auVar31,auVar28);
    auVar35 = vinsertps_avx(auVar27,auVar27,0x4a);
    auVar31 = vunpcklps_avx(auVar28,ZEXT416(auVar27._0_4_));
    auVar32 = vunpcklps_avx(auVar30,auVar35);
    auVar27 = vunpckhps_avx(auVar30,auVar35);
    auVar35 = vdpps_avx((undefined1  [16])a0_1.field_0,auVar29,0x7f);
    auVar28 = vshufps_avx(auVar35,auVar35,0);
    auVar35 = vdivps_avx(auVar32,auVar28);
    auVar27 = vdivps_avx(auVar27,auVar28);
    auVar28 = vdivps_avx(auVar31,auVar28);
    auVar29 = vshufps_avx(auVar33,auVar33,0);
    auVar30 = vshufps_avx(auVar33,auVar33,0x55);
    auVar33 = vshufps_avx(auVar33,auVar33,0xaa);
    fVar46 = auVar28._0_4_;
    fVar53 = auVar28._4_4_;
    fVar43 = auVar28._8_4_;
    fVar48 = auVar28._12_4_;
    fVar52 = auVar27._0_4_;
    fVar54 = auVar27._4_4_;
    fVar44 = auVar27._8_4_;
    fVar9 = auVar27._12_4_;
    fVar42 = auVar35._0_4_;
    fVar8 = auVar35._4_4_;
    fVar47 = auVar35._8_4_;
    fVar10 = auVar35._12_4_;
    auVar24._0_4_ = auVar29._0_4_ * fVar42 + auVar30._0_4_ * fVar52 + auVar33._0_4_ * fVar46;
    auVar24._4_4_ = auVar29._4_4_ * fVar8 + auVar30._4_4_ * fVar54 + auVar33._4_4_ * fVar53;
    auVar24._8_4_ = auVar29._8_4_ * fVar47 + auVar30._8_4_ * fVar44 + auVar33._8_4_ * fVar43;
    auVar24._12_4_ = auVar29._12_4_ * fVar10 + auVar30._12_4_ * fVar9 + auVar33._12_4_ * fVar48;
    uVar11 = *(undefined8 *)&(ray->super_RayK<1>).org.field_0;
    uVar12 = *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    fVar37 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar49 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar45 = (ray->super_RayK<1>).org.field_0.m128[2];
    auVar51._0_4_ = fVar45 * fVar46;
    auVar51._4_4_ = fVar45 * fVar53;
    auVar51._8_4_ = fVar45 * fVar43;
    auVar51._12_4_ = fVar45 * fVar48;
    auVar33 = vsubps_avx(auVar51,auVar24);
    auVar25._0_4_ = fVar37 * fVar42 + fVar49 * fVar52 + auVar33._0_4_;
    auVar25._4_4_ = fVar37 * fVar8 + fVar49 * fVar54 + auVar33._4_4_;
    auVar25._8_4_ = fVar37 * fVar47 + fVar49 * fVar44 + auVar33._8_4_;
    auVar25._12_4_ = fVar37 * fVar10 + fVar49 * fVar9 + auVar33._12_4_;
    aVar7 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
            vinsertps_avx(auVar25,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),0x30);
    uVar13 = *(undefined8 *)&(ray->super_RayK<1>).dir.field_0;
    uVar14 = *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
    (ray->super_RayK<1>).org.field_0 = aVar7;
    fVar37 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fVar49 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fVar45 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar26._0_4_ = fVar37 * fVar42 + fVar49 * fVar52 + fVar45 * fVar46;
    auVar26._4_4_ = fVar37 * fVar8 + fVar49 * fVar54 + fVar45 * fVar53;
    auVar26._8_4_ = fVar37 * fVar47 + fVar49 * fVar44 + fVar45 * fVar43;
    auVar26._12_4_ = fVar37 * fVar10 + fVar49 * fVar9 + fVar45 * fVar48;
    aVar7 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
            vinsertps_avx(auVar26,ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[3]),0x30);
    (ray->super_RayK<1>).dir.field_0 = aVar7;
    (**(code **)(p_Var16 + 0x78))(p_Var16 + 0x58,ray);
    *(undefined8 *)&(ray->super_RayK<1>).org.field_0 = uVar11;
    *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8) = uVar12;
    *(undefined8 *)&(ray->super_RayK<1>).dir.field_0 = uVar13;
    *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8) = uVar14;
    pRVar4->instID[0] = 0xffffffff;
    pRVar4->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceArrayIntersector1::intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
    {
      InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return;
#endif

      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_);
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect((RTCRayHit&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }